

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

sftp_packet * sftp_recv(void)

{
  _Bool _Var1;
  uint32_t length;
  char local_1c [4];
  uint pktlen;
  char x [4];
  sftp_packet *pkt;
  
  _Var1 = sftp_recvdata(local_1c,4);
  if (_Var1) {
    length = GET_32BIT_MSB_FIRST(local_1c);
    if (length < 0x100001) {
      _pktlen = sftp_recv_prepare(length);
      _Var1 = sftp_recvdata(_pktlen->data,_pktlen->length);
      if (_Var1) {
        _Var1 = sftp_recv_finish(_pktlen);
        if (_Var1) {
          pkt = _pktlen;
        }
        else {
          sftp_pkt_free(_pktlen);
          pkt = (sftp_packet *)0x0;
        }
      }
      else {
        sftp_pkt_free(_pktlen);
        pkt = (sftp_packet *)0x0;
      }
    }
    else {
      pkt = (sftp_packet *)0x0;
    }
  }
  else {
    pkt = (sftp_packet *)0x0;
  }
  return pkt;
}

Assistant:

struct sftp_packet *sftp_recv(void)
{
    struct sftp_packet *pkt;
    char x[4];

    if (!sftp_recvdata(x, 4))
        return NULL;

    /* Impose _some_ upper bound on packet size. We never expect to
     * receive more than 32K of data in response to an FXP_READ,
     * because we decide how much data to ask for. FXP_READDIR and
     * pathname-returning things like FXP_REALPATH don't have an
     * explicit bound, so I suppose we just have to trust the server
     * to be sensible. */
    unsigned pktlen = GET_32BIT_MSB_FIRST(x);
    if (pktlen > (1<<20))
        return NULL;

    pkt = sftp_recv_prepare(pktlen);

    if (!sftp_recvdata(pkt->data, pkt->length)) {
        sftp_pkt_free(pkt);
        return NULL;
    }

    if (!sftp_recv_finish(pkt)) {
        sftp_pkt_free(pkt);
        return NULL;
    }

    return pkt;
}